

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.c
# Opt level: O0

Spot * board_spotGet(Board *board,SPOTTYPE spotType,uchar spotIndex)

{
  Spot *pSVar1;
  Spot *spot;
  uchar i;
  uchar spotIndex_local;
  SPOTTYPE spotType_local;
  Board *board_local;
  
  i = '\0';
  while( true ) {
    if (board->spotsCount <= i) {
      return (Spot *)0x0;
    }
    pSVar1 = board->spots[i];
    if ((pSVar1->type == spotType) && (pSVar1->index == spotIndex)) break;
    i = i + '\x01';
  }
  return pSVar1;
}

Assistant:

Spot * board_spotGet(Board * board, SPOTTYPE spotType, unsigned char spotIndex)
{
	unsigned char i;
	Spot * spot;

	for(i=0;i<board->spotsCount;i++)
	{
		spot = board->spots[i];

		if(spot->type==spotType && spot->index==spotIndex)
			return spot;
	}

	return 0;
}